

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.c
# Opt level: O0

int32 host_endian(void)

{
  FILE *pFVar1;
  size_t sVar2;
  undefined4 local_34;
  int32 endian;
  int32 k;
  char buf [8];
  char *file;
  int32 BYTE_ORDER_MAGIC;
  FILE *fp;
  
  buf = (char  [8])anon_var_dwarf_13bdc;
  pFVar1 = fopen("/tmp/__EnDiAn_TeSt__","wb");
  if (pFVar1 == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/profile.c"
            ,0x139,"Failed to open file \'%s\' for writing",buf);
    fp._4_4_ = 0xffffffff;
  }
  else {
    local_34 = 0x11223344;
    sVar2 = fwrite(&local_34,4,1,pFVar1);
    if (sVar2 == 1) {
      fclose(pFVar1);
      pFVar1 = fopen((char *)buf,"rb");
      if (pFVar1 == (FILE *)0x0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/profile.c"
                       ,0x149,"Failed to open file \'%s\' for reading",buf);
        unlink((char *)buf);
        fp._4_4_ = 0xffffffff;
      }
      else {
        sVar2 = fread(&endian,1,4,pFVar1);
        if (sVar2 == 4) {
          fclose(pFVar1);
          unlink((char *)buf);
          fp._4_4_ = (uint)((char)endian == 'D');
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/profile.c"
                  ,0x14e,"Failed to read from file \'%s\'\n",buf);
          fclose(pFVar1);
          unlink((char *)buf);
          fp._4_4_ = 0xffffffff;
        }
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/profile.c"
              ,0x141,"Failed to write to file \'%s\'\n",buf);
      fclose(pFVar1);
      unlink((char *)buf);
      fp._4_4_ = 0xffffffff;
    }
  }
  return fp._4_4_;
}

Assistant:

int32
host_endian(void)
{
    FILE *fp;
    int32 BYTE_ORDER_MAGIC;
    char *file;
    char buf[8];
    int32 k, endian;

    file = "/tmp/__EnDiAn_TeSt__";

    if ((fp = fopen(file, "wb")) == NULL) {
        E_ERROR("Failed to open file '%s' for writing", file);
        return -1;
    }

    BYTE_ORDER_MAGIC = (int32) 0x11223344;

    k = (int32) BYTE_ORDER_MAGIC;
    if (fwrite(&k, sizeof(int32), 1, fp) != 1) {
        E_ERROR("Failed to write to file '%s'\n", file);
        fclose(fp);
        unlink(file);
        return -1;
    }

    fclose(fp);
    if ((fp = fopen(file, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file);
        unlink(file);
        return -1;
    }
    if (fread(buf, 1, sizeof(int32), fp) != sizeof(int32)) {
        E_ERROR("Failed to read from file '%s'\n", file);
        fclose(fp);
        unlink(file);
        return -1;
    }
    fclose(fp);
    unlink(file);

    /* If buf[0] == lsB of BYTE_ORDER_MAGIC, we are little-endian */
    endian = (buf[0] == (BYTE_ORDER_MAGIC & 0x000000ff)) ? 1 : 0;

    return (endian);
}